

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMessenger *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 this_01;
  size_type sVar3;
  bool bVar4;
  cmListFileLexer_Token *pcVar5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  Delimiter delim;
  anon_enum_32 aVar9;
  cmListFileContext lfc;
  ostringstream error;
  undefined1 local_2c8 [32];
  string local_2a8;
  cmListFileContext local_288;
  undefined1 local_218 [376];
  cmListFileContext local_a0;
  
  pcVar7 = (char *)(this->FunctionName)._M_string_length;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&this->FunctionName,0,pcVar7,(ulong)name);
  this->FunctionLine = line;
  do {
    pcVar5 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar5 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Unexpected end of file.\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Parse error.  Function missing opening \"(\".",0x2b);
      std::__cxx11::stringbuf::str();
      IssueError(this,&local_288.Name);
      goto LAB_002c31ff;
    }
  } while (pcVar5->type == cmListFileLexer_Token_Space);
  if (pcVar5->type == cmListFileLexer_Token_ParenLeft) {
    this->Separation = SeparationOkay;
    pcVar5 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar5 != (cmListFileLexer_Token *)0x0) {
      local_2c8._24_8_ = 0;
      do {
        if (pcVar5->type - cmListFileLexer_Token_Space < 2) {
          this->Separation = SeparationOkay;
          goto LAB_002c2f04;
        }
        switch(pcVar5->type) {
        case cmListFileLexer_Token_Identifier:
        case cmListFileLexer_Token_ArgumentUnquoted:
          bVar4 = AddArgument(this,pcVar5,Unquoted);
          aVar9 = SeparationWarning;
          if (!bVar4) {
            return false;
          }
          break;
        case cmListFileLexer_Token_ParenLeft:
          this->Separation = SeparationOkay;
          bVar4 = AddArgument(this,pcVar5,Unquoted);
          if (!bVar4) {
            return false;
          }
          local_2c8._24_8_ = local_2c8._24_8_ + 1;
          goto LAB_002c2f04;
        case cmListFileLexer_Token_ParenRight:
          if (local_2c8._24_8_ == 0) {
            this->FunctionLineEnd = (long)pcVar5->line;
            return true;
          }
          this->Separation = SeparationOkay;
          bVar4 = AddArgument(this,pcVar5,Unquoted);
          if (!bVar4) {
            return false;
          }
          local_2c8._24_8_ = local_2c8._24_8_ + -1;
          aVar9 = SeparationWarning;
          break;
        case cmListFileLexer_Token_ArgumentQuoted:
          aVar9 = SeparationWarning;
          delim = Quoted;
          goto LAB_002c2fdd;
        case cmListFileLexer_Token_ArgumentBracket:
          aVar9 = SeparationError;
          delim = Bracket;
LAB_002c2fdd:
          bVar4 = AddArgument(this,pcVar5,delim);
          if (!bVar4) {
            return false;
          }
          break;
        case cmListFileLexer_Token_CommentBracket:
          aVar9 = SeparationError;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Parse error.  Function missing ending \")\".  ",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Instead found ",0xe);
          pcVar7 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar5->type);
          poVar8 = std::operator<<((ostream *)local_218,pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," with text \"",0xc);
          poVar8 = std::operator<<(poVar8,pcVar5->text);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
          std::__cxx11::stringbuf::str();
          IssueError(this,&local_288.Name);
          goto LAB_002c31ff;
        }
        this->Separation = aVar9;
LAB_002c2f04:
        pcVar5 = cmListFileLexer_Scan(this->Lexer);
      } while (pcVar5 != (cmListFileLexer_Token *)0x0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    paVar2 = &local_288.Name.field_2;
    local_288.Name._M_string_length = 0;
    local_288.Name.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_288.FilePath.field_2;
    local_288.FilePath._M_string_length = 0;
    local_288.FilePath.field_2._M_local_buf[0] = '\0';
    local_288.Line = 0;
    local_288.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    pcVar7 = this->FileName;
    local_288.Name._M_dataplus._M_p = (pointer)paVar2;
    local_288.FilePath._M_dataplus._M_p = (pointer)paVar1;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_288.FilePath,0,(char *)0x0,(ulong)pcVar7);
    local_2c8._0_8_ =
         (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_2c8._8_8_ =
         (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count + 1;
      }
    }
    local_288.Line = line;
    cmListFileContext::cmListFileContext(&local_a0,&local_288);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_2c8 + 0x20),
               (cmListFileContext *)local_2c8);
    sVar3 = local_2a8._M_string_length;
    local_2c8._0_8_ = local_2a8._M_dataplus._M_p;
    this_01 = local_2c8._8_8_;
    local_2a8._M_dataplus._M_p = (pointer)0x0;
    local_2a8._M_string_length = 0;
    local_2c8._8_8_ = sVar3;
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._M_string_length);
    }
    if ((local_a0.DeferId.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (local_a0.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false,
       local_a0.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_dataplus._M_p !=
       ((pointer)
       ((long)&local_a0.DeferId.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x10U))._M_p)) {
      operator_delete((void *)local_a0.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_a0.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
      operator_delete(local_a0.FilePath._M_dataplus._M_p,
                      local_a0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
      operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1
                     );
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Parse error.  Function missing ending \")\".  ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"End of file reached.",0x14);
    this_00 = this->Messenger;
    std::__cxx11::stringbuf::str();
    cmMessenger::IssueMessage
              (this_00,FATAL_ERROR,(string *)(local_2c8 + 0x20),(cmListFileBacktrace *)local_2c8);
    if (local_2a8._M_dataplus._M_p != local_2c8 + 0x30) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
    }
    if ((local_288.DeferId.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (local_288.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false,
       local_288.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_dataplus._M_p !=
       ((pointer)
       ((long)&local_288.DeferId.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       + 0x10U))._M_p)) {
      operator_delete((void *)local_288.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_288.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.FilePath._M_dataplus._M_p != paVar1) {
      operator_delete(local_288.FilePath._M_dataplus._M_p,
                      CONCAT71(local_288.FilePath.field_2._M_allocated_capacity._1_7_,
                               local_288.FilePath.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.Name._M_dataplus._M_p == paVar2) goto LAB_002c321a;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,"Parse error.  Expected \"(\", got ",0x20);
    pcVar7 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar5->type);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)local_2c8 + (int)*(_func_int **)(local_218._0_8_ + -0x18) + 0xb0);
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar7,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," with text \"",0xc);
    pcVar7 = pcVar5->text;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)local_2c8 + (int)*(_func_int **)(local_218._0_8_ + -0x18) + 0xb0);
    }
    else {
      sVar6 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar7,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\".",2);
    std::__cxx11::stringbuf::str();
    IssueError(this,&local_288.Name);
LAB_002c31ff:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.Name._M_dataplus._M_p == &local_288.Name.field_2) goto LAB_002c321a;
  }
  operator_delete(local_288.Name._M_dataplus._M_p,
                  CONCAT71(local_288.Name.field_2._M_allocated_capacity._1_7_,
                           local_288.Name.field_2._M_local_buf[0]) + 1);
LAB_002c321a:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
  return false;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->FunctionName = name;
  this->FunctionLine = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        this->FunctionLineEnd = token->line;
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}